

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

db_bit_type __thiscall lan::db::convert_to_bit_type(db *this,char type)

{
  int iVar1;
  db_bit_type local_20;
  uint i;
  char type_local;
  db *this_local;
  
  iVar1 = tolower((int)type);
  local_20 = Bool;
  while( true ) {
    if (Container < local_20) {
      return Unsafe;
    }
    if ((char)iVar1 == db_bit_table[local_20]) break;
    local_20 = local_20 + Int;
  }
  return local_20;
}

Assistant:

lan::db_bit_type db::convert_to_bit_type(char type){
            type = std::tolower(type);
            for(uint i = Bool ; i <= Container ; i++ )
                if(type == db_bit_table[i])
                    return (db_bit_type)i;
                return Unsafe;
        }